

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O1

void test_read_append_wrong_filter(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *_a;
  char *e1;
  longlong v1;
  archive_entry *ae;
  archive_entry *local_20;
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'\x9d',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_set_format(_a,L'\x00030000');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'\x9e',(uint)(wVar1 == L'\0'),
                   "0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR)",_a);
  iVar2 = archive_read_append_filter(_a,6);
  if (iVar2 == -0x14) {
    wVar1 = canXz();
    if (wVar1 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'¡');
      test_skipping("xz reading not fully supported on this platform");
      wVar1 = L'¢';
      goto LAB_001a1266;
    }
    iVar2 = archive_read_open_memory(_a,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'¦',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_open_memory(a, archive, sizeof(archive))",(void *)0x0);
    iVar2 = archive_read_next_header(_a,&local_20);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'§',(uint)(iVar2 < -0x14),
                     "archive_read_next_header(a, &ae) < (ARCHIVE_WARN)",_a);
    wVar1 = canXz();
    if (wVar1 == L'\0') goto LAB_001a1231;
    iVar2 = archive_read_close(_a);
    e1 = "ARCHIVE_WARN";
    wVar1 = L'©';
    v1 = -0x14;
  }
  else {
    iVar2 = archive_read_open_memory(_a,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'¦',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_open_memory(a, archive, sizeof(archive))",(void *)0x0);
    iVar2 = archive_read_next_header(_a,&local_20);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'§',(uint)(iVar2 < -0x14),
                     "archive_read_next_header(a, &ae) < (ARCHIVE_WARN)",_a);
LAB_001a1231:
    iVar2 = archive_read_close(_a);
    e1 = "ARCHIVE_OK";
    wVar1 = L'«';
    v1 = 0;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,wVar1,v1,e1,(long)iVar2,"archive_read_close(a)",_a);
  wVar1 = L'­';
LAB_001a1266:
  iVar2 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,wVar1,0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_append_wrong_filter)
{
  struct archive_entry *ae;
  struct archive *a;
  int r;

  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  r = archive_read_append_filter(a, ARCHIVE_FILTER_XZ);
  if (r == ARCHIVE_WARN && !canXz()) {
    skipping("xz reading not fully supported on this platform");
    assertEqualInt(ARCHIVE_OK, archive_read_free(a));
    return;
  }
  assertEqualInt(ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  if (r == ARCHIVE_WARN && canXz()) {
    assertEqualIntA(a, ARCHIVE_WARN, archive_read_close(a));
  } else {
    assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  }
  assertEqualInt(ARCHIVE_OK,archive_read_free(a));
}